

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererParallelTests.cpp
# Opt level: O0

void __thiscall
agge::tests::RendererParallelTests::SingleThreadedRenderingIsDoneInSingleThread
          (RendererParallelTests *this)

{
  cell *pcVar1;
  cell *pcVar2;
  agge_vector<int> offset;
  allocator local_251;
  string local_250 [32];
  LocationInfo local_230;
  unsigned_short auStack_208 [4];
  uint16_t reference [20];
  undefined1 local_1d0 [8];
  renderer_parallel r;
  thread_mapping_blender<unsigned_short,_unsigned_char> blender;
  mutex mtx;
  thread_mapping mapping;
  undefined1 local_100 [8];
  bitmap<unsigned_short,_0UL,_0UL> bitmap;
  mask_full<8UL> mask;
  scanline_cells cells [3];
  cell cells3 [2];
  undefined1 auStack_68 [8];
  cell cells2 [3];
  undefined1 auStack_38 [8];
  cell cells1 [3];
  RendererParallelTests *this_local;
  
  auStack_38._0_4_ = 0;
  auStack_38._4_4_ = 0;
  cells1[0].x = 0x11;
  cells1[0].area = 2;
  cells1[0].cover = 0;
  cells1[1].x = -3;
  cells1[1].area = 4;
  cells1[1].cover = 0;
  cells1[2].x = -0xe;
  auStack_68._0_4_ = 1;
  auStack_68._4_4_ = 0;
  cells2[0].x = 0xab;
  cells2[0].area = 2;
  cells2[0].cover = 0;
  cells2[1].x = -0x1e;
  cells2[1].area = 5;
  cells2[1].cover = 0;
  cells2[2].x = -0x8d;
  cells[2].second = (cell *)0x1;
  unique0x10000640 = this;
  pcVar1 = begin<agge::tests::mocks::cell_const,3ul>((cell (*) [3])auStack_38);
  pcVar2 = end<agge::tests::mocks::cell_const,3ul>((cell (*) [3])auStack_38);
  join_0x00000010_0x00000000_ =
       std::make_pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>
                 (pcVar1,pcVar2);
  pcVar1 = begin<agge::tests::mocks::cell_const,3ul>((cell (*) [3])auStack_68);
  pcVar2 = end<agge::tests::mocks::cell_const,3ul>((cell (*) [3])auStack_68);
  cells._8_16_ = (undefined1  [16])
                 std::make_pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>
                           (pcVar1,pcVar2);
  pcVar1 = begin<agge::tests::mocks::cell_const,2ul>((cell (*) [2])&cells[2].second);
  pcVar2 = end<agge::tests::mocks::cell_const,2ul>((cell (*) [2])&cells[2].second);
  cells._24_16_ =
       (undefined1  [16])
       std::make_pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>
                 (pcVar1,pcVar2);
  tests::mocks::mask_full<8ul>::
  mask_full<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,3>
            ((mask_full<8ul> *)&bitmap._width,
             (pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*) [3])
             &mask.super_mask<8UL>._cells.
              super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
  tests::mocks::bitmap<unsigned_short,_0UL,_0UL>::bitmap
            ((bitmap<unsigned_short,_0UL,_0UL> *)local_100,5,4);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(mtx._buffer + 0x5c));
  mutex::mutex((mutex *)((long)&blender._mtx + 4));
  tests::mocks::thread_mapping_blender<unsigned_short,_unsigned_char>::thread_mapping_blender
            ((thread_mapping_blender<unsigned_short,_unsigned_char> *)&r._parallelism,
             (thread_mapping *)(mtx._buffer + 0x5c),(mutex *)((long)&blender._mtx + 4));
  renderer_parallel::renderer_parallel((renderer_parallel *)local_1d0,1);
  offset = zero::operator_cast_to_agge_vector((zero *)((long)reference + 0x27));
  renderer_parallel::operator()
            ((renderer_parallel *)local_1d0,(bitmap<unsigned_short,_0UL,_0UL> *)local_100,offset,
             (rect_i *)0x0,(mask_full<8UL> *)&bitmap._width,
             (thread_mapping_blender<unsigned_short,_unsigned_char> *)&r._parallelism,
             (simple_alpha<unsigned_char,_8UL> *)(reference + 0x13));
  reference[4] = 0xe;
  reference[5] = 0;
  reference[6] = 0;
  reference[7] = 0xab;
  reference[8] = 0x8d;
  reference[9] = 0x8d;
  reference[10] = 0x8d;
  reference[0xb] = 0;
  auStack_208[0] = 0;
  auStack_208[1] = 0;
  auStack_208[2] = 0;
  auStack_208[3] = 0;
  reference[0] = 0;
  reference[1] = 0x11;
  reference[2] = 0x11;
  reference[3] = 0xe;
  reference[0xc] = 0xa0;
  reference[0xd] = 0xa0;
  reference[0xe] = 0xa0;
  reference[0xf] = 0xa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_250,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,&local_251);
  ut::LocationInfo::LocationInfo(&local_230,(string *)local_250,0x77);
  ut::are_equal<unsigned_short,20ul,std::vector<unsigned_short,std::allocator<unsigned_short>>>
            ((unsigned_short (*) [20])auStack_208,
             (vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_100,&local_230);
  ut::LocationInfo::~LocationInfo(&local_230);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  renderer_parallel::~renderer_parallel((renderer_parallel *)local_1d0);
  mutex::~mutex((mutex *)((long)&blender._mtx + 4));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(mtx._buffer + 0x5c));
  tests::mocks::bitmap<unsigned_short,_0UL,_0UL>::~bitmap
            ((bitmap<unsigned_short,_0UL,_0UL> *)local_100);
  tests::mocks::mask_full<8UL>::~mask_full((mask_full<8UL> *)&bitmap._width);
  return;
}

Assistant:

test( SingleThreadedRenderingIsDoneInSingleThread )
			{
				// INIT
				const mocks::cell cells1[] = { { 0, 0, 0x11 }, { 2, 0, -0x03 }, { 4, 0, -0x0E }, };
				const mocks::cell cells2[] = { { 1, 0, 0xAB }, { 2, 0, -0x1E }, { 5, 0, -0x8D }, };
				const mocks::cell cells3[] = { { 1, 0, 0xA0 }, { 9, 0, -0xA0 }, };
				mocks::mask<8>::scanline_cells cells[] = {
					make_pair(begin(cells1), end(cells1)),
					make_pair(begin(cells2), end(cells2)),
					make_pair(begin(cells3), end(cells3)),
				};
				mocks::mask_full<8> mask(cells, 1);
				mocks::bitmap<uint16_t> bitmap(5, 4);
				thread_mapping mapping;
				mutex mtx;
				mocks::thread_mapping_blender<uint16_t, uint8_t> blender(mapping, mtx);

				renderer_parallel r(1);

				// ACT
				r(bitmap, zero(), 0, mask, blender, mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				uint16_t reference[] = {
					0x0000, 0x0000, 0x0000, 0x0000, 0x0000,
					0x0011, 0x0011, 0x000E, 0x000E, 0x0000,
					0x0000, 0x00AB, 0x008D, 0x008D, 0x008D,
					0x0000, 0x00A0, 0x00A0, 0x00A0, 0x00A0,
				};

				assert_equal(reference, bitmap.data);
			}